

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::ScriptFunction::MarkVisitKindSpecificPtrs(ScriptFunction *this,SnapshotExtractor *extractor)

{
  FrameDisplay *environment;
  ActivationObjectEx *var;
  int iVar1;
  ParseableFunctionInfo *pfi;
  FunctionBody *fb;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
  fb = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
  TTD::SnapshotExtractor::MarkFunctionBody(extractor,fb);
  environment = (this->environment).ptr;
  if (environment->length != 0) {
    TTD::SnapshotExtractor::MarkScriptFunctionScopeInfo(extractor,environment);
  }
  var = (this->cachedScopeObj).ptr;
  if (var != (ActivationObjectEx *)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  iVar1 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x76])(this);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(Var)CONCAT44(extraout_var_00,iVar1));
  }
  iVar1 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])(this);
  if (CONCAT44(extraout_var_01,iVar1) != 0) {
    iVar1 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x73])(this);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,(Var)CONCAT44(extraout_var_02,iVar1));
    return;
  }
  return;
}

Assistant:

void ScriptFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(this->GetParseableFunctionInfo());
        extractor->MarkFunctionBody(fb);

        Js::FrameDisplay* environment = this->GetEnvironment();
        if(environment->GetLength() != 0)
        {
            extractor->MarkScriptFunctionScopeInfo(environment);
        }

        if(this->cachedScopeObj != nullptr)
        {
            extractor->MarkVisitVar(this->cachedScopeObj);
        }

        if (this->GetComputedNameVar() != nullptr)
        {
            extractor->MarkVisitVar(this->GetComputedNameVar());
        }

        if (this->GetHomeObj() != nullptr)
        {
            extractor->MarkVisitVar(this->GetHomeObj());
        }
    }